

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_PEMX509Info_Test::TestBody(X509Test_PEMX509Info_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  long lVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  EVP_PKEY *__p;
  void *pvVar5;
  BIO *pBVar6;
  pointer psVar7;
  X509_INFO *pXVar8;
  stack_st_X509_INFO *psVar9;
  char *in_R9;
  AssertHelper local_9d8;
  Message local_9d0;
  size_t local_9c8;
  unsigned_long local_9c0;
  undefined1 local_9b8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_988;
  Message local_980;
  bool local_971;
  undefined1 local_970 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_940;
  Message local_938;
  undefined1 local_930 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_900;
  Message local_8f8;
  bool local_8e9;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<struct_stack_st_X509_INFO> infos2;
  AssertHelper local_8b0;
  Message local_8a8;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar__7;
  undefined1 local_870 [8];
  string bad_pem;
  ulong uStack_848;
  ScopedTrace gtest_trace_3104;
  size_t i_1;
  Message local_838;
  size_t local_830;
  unsigned_long local_828;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_2;
  Message local_808;
  stack_st_X509_INFO *local_800;
  pointer local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_7c0;
  Message local_7b8;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar__6;
  ulong uStack_798;
  ScopedTrace gtest_trace_3093;
  size_t i;
  Message local_788;
  size_t local_780;
  unsigned_long local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar;
  AssertHelper local_740;
  Message local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<struct_stack_st_X509_INFO> infos;
  AssertHelper local_6f8;
  Message local_6f0;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__4;
  UniquePtr<BIO> bio;
  anon_class_1_0_00000001 check_info;
  ExpectedInfo kExpected [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string pem;
  undefined1 local_230 [8];
  string encrypted_key;
  undefined1 local_208 [8];
  string invalid;
  undefined1 local_1e0 [8];
  string unknown;
  AssertHelper local_1a0;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<EVP_PKEY> placeholder_key;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509_CRL> crl_obj;
  undefined1 local_128 [8];
  string crl;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY> rsa_obj;
  undefined1 local_b8 [8];
  string rsa;
  string local_90;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509> cert_obj;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string cert;
  X509Test_PEMX509Info_Test *this_local;
  
  cert.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  CertFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
              "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
             );
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_60,
             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_60,(AssertionResult *)"cert_obj","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xba7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_68);
  }
  rsa.field_2._13_3_ = 0;
  rsa.field_2._M_local_buf[0xc] = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (rsa.field_2._12_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,(anonymous_namespace)::kRSAKey,
               (allocator<char> *)
               ((long)&rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rsa_obj._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 7));
    PrivateKeyFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__1.message_,
                      (anonymous_namespace)::kRSAKey);
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_d8,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0
              );
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)((long)&crl.field_2 + 8),(internal *)local_d8,
                 (AssertionResult *)"rsa_obj","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xbab,pcVar4);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)(crl.field_2._M_local_buf + 8));
      testing::Message::~Message(&local_e0);
    }
    rsa.field_2._13_3_ = 0;
    rsa.field_2._M_local_buf[0xc] = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (rsa.field_2._12_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_128,
                 "\n-----BEGIN X509 CRL-----\nMIIBpzCBkAIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE\nCAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ\nQm9yaW5nU1NMFw0xNjA5MjYxNTEwNTVaFw0xNjEwMjYxNTEwNTVaoA4wDDAKBgNV\nHRQEAwIBATANBgkqhkiG9w0BAQsFAAOCAQEAnrBKKgvd9x9zwK9rtUvVeFeJ7+LN\nZEAc+a5oxpPNEsJx6hXoApYEbzXMxuWBQoCs5iEBycSGudct21L+MVf27M38KrWo\neOkq0a2siqViQZO2Fb/SUFR0k9zb8xl86Zf65lgPplALun0bV/HT7MJcl04Tc4os\ndsAReBs5nqTGNEd5AlC1iKHvQZkM//MD51DspKnDpsDiUVi54h9C1SpfZmX8H2Vv\ndiyu0fZ/bPAM3VAGawatf/SyWfBMyKpoPXEG39oAzmjjOj8en82psn7m474IGaho\n/vBbhl1ms5qQiLYPjm4YELtnXQoFyC72tBjbdFd/ZE9k4CNKDbxFUXFbkw==\n-----END X509 CRL-----\n"
                 ,(allocator<char> *)
                  ((long)&crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&crl_obj._M_t.super___uniq_ptr_impl<X509_crl_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_X509_crl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_X509_crl_st_*,_false>._M_head_impl + 7));
      CRLFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar__2.message_,
                 "\n-----BEGIN X509 CRL-----\nMIIBpzCBkAIBATANBgkqhkiG9w0BAQsFADBOMQswCQYDVQQGEwJVUzETMBEGA1UE\nCAwKQ2FsaWZvcm5pYTEWMBQGA1UEBwwNTW91bnRhaW4gVmlldzESMBAGA1UECgwJ\nQm9yaW5nU1NMFw0xNjA5MjYxNTEwNTVaFw0xNjEwMjYxNTEwNTVaoA4wDDAKBgNV\nHRQEAwIBATANBgkqhkiG9w0BAQsFAAOCAQEAnrBKKgvd9x9zwK9rtUvVeFeJ7+LN\nZEAc+a5oxpPNEsJx6hXoApYEbzXMxuWBQoCs5iEBycSGudct21L+MVf27M38KrWo\neOkq0a2siqViQZO2Fb/SUFR0k9zb8xl86Zf65lgPplALun0bV/HT7MJcl04Tc4os\ndsAReBs5nqTGNEd5AlC1iKHvQZkM//MD51DspKnDpsDiUVi54h9C1SpfZmX8H2Vv\ndiyu0fZ/bPAM3VAGawatf/SyWfBMyKpoPXEG39oAzmjjOj8en82psn7m474IGaho\n/vBbhl1ms5qQiLYPjm4YELtnXQoFyC72tBjbdFd/ZE9k4CNKDbxFUXFbkw==\n-----END X509 CRL-----\n"
                );
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<X509_crl_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_148,
                 (unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar2) {
        testing::Message::Message(&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&placeholder_key,(internal *)local_148,(AssertionResult *)"crl_obj",
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xbaf,pcVar4);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        std::__cxx11::string::~string((string *)&placeholder_key);
        testing::Message::~Message(&local_150);
      }
      rsa.field_2._13_3_ = 0;
      rsa.field_2._M_local_buf[0xc] = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      if (rsa.field_2._12_4_ == 0) {
        __p = EVP_PKEY_new();
        std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (pointer)__p);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_190,
                   (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,
                   (type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
        if (!bVar2) {
          testing::Message::Message(&local_198);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)((long)&unknown.field_2 + 8),(internal *)local_190,
                     (AssertionResult *)"placeholder_key","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xbb2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
          testing::internal::AssertHelper::~AssertHelper(&local_1a0);
          std::__cxx11::string::~string((string *)(unknown.field_2._M_local_buf + 8));
          testing::Message::~Message(&local_198);
        }
        rsa.field_2._13_3_ = 0;
        rsa.field_2._M_local_buf[0xc] = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
        if (rsa.field_2._12_4_ == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e0,"-----BEGIN UNKNOWN-----\nAAAA\n-----END UNKNOWN-----\n",
                     (allocator<char> *)(invalid.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(invalid.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_208,
                     "-----BEGIN CERTIFICATE-----\nAAAA\n-----END CERTIFICATE-----\n",
                     (allocator<char> *)(encrypted_key.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(encrypted_key.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_230,
                     "-----BEGIN EC PRIVATE KEY-----\nProc-Type: 4,ENCRYPTED\nDEK-Info: AES-128-CBC,B3B2988AECAE6EAB0D043105994C1123\n\nRK7DUIGDHWTFh2rpTX+dR88hUyC1PyDlIULiNCkuWFwHrJbc1gM6hMVOKmU196XC\niITrIKmilFm9CPD6Tpfk/NhI/QPxyJlk1geIkxpvUZ2FCeMuYI1To14oYOUKv14q\nwr6JtaX2G+pOmwcSPymZC4u2TncAP7KHgS8UGcMw8CE=\n-----END EC PRIVATE KEY-----\n"
                     ,(allocator<char> *)(pem.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(pem.field_2._M_local_buf + 0xf));
          std::operator+(&local_558,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8);
          std::operator+(&local_538,&local_558,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_518,&local_538,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_4f8,&local_518,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_4d8,&local_4f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_4b8,&local_4d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_498,&local_4b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e0);
          std::operator+(&local_478,&local_498,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_458,&local_478,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_438,&local_458,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_418,&local_438,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_3f8,&local_418,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_3d8,&local_3f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_3b8,&local_3d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_398,&local_3b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_378,&local_398,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_358,&local_378,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_338,&local_358,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_318,&local_338,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_2f8,&local_318,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_2d8,&local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_2b8,&local_2d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          std::operator+(&local_298,&local_2b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
          std::operator+(&local_278,&local_298,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_230);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_338);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_378);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::~string((string *)&local_538);
          std::__cxx11::string::~string((string *)&local_558);
          this_00 = &gtest_ar_.message_;
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          this_01 = &gtest_ar__1.message_;
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          this_02 = &gtest_ar__2.message_;
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)this_00);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)this_02);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)this_01);
          pvVar5 = (void *)std::__cxx11::string::data();
          iVar3 = std::__cxx11::string::size();
          pBVar6 = BIO_new_mem_buf(pvVar5,iVar3);
          std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (pointer)pBVar6);
          testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                    ((AssertionResult *)local_6e8,
                     (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                     (type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
          if (!bVar2) {
            testing::Message::Message(&local_6f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&infos,(internal *)local_6e8,(AssertionResult *)0x8a2d4f,"false",
                       "true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_6f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xc0f,pcVar4);
            testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
            testing::internal::AssertHelper::~AssertHelper(&local_6f8);
            std::__cxx11::string::~string((string *)&infos);
            testing::Message::~Message(&local_6f0);
          }
          rsa.field_2._13_3_ = 0;
          rsa.field_2._M_local_buf[0xc] = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
          if (rsa.field_2._12_4_ == 0) {
            pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                      ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                       &gtest_ar__4.message_);
            psVar7 = (pointer)PEM_X509_INFO_read_bio
                                        (pBVar6,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,
                                         (void *)0x0);
            std::unique_ptr<stack_st_X509_INFO,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<stack_st_X509_INFO,bssl::internal::Deleter> *)
                       &gtest_ar__5.message_,psVar7);
            testing::AssertionResult::
            AssertionResult<std::unique_ptr<stack_st_X509_INFO,bssl::internal::Deleter>>
                      ((AssertionResult *)local_730,
                       (unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                       &gtest_ar__5.message_,(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
            if (!bVar2) {
              testing::Message::Message(&local_738);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar.message_,(internal *)local_730,
                         (AssertionResult *)"infos","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_740,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xc12,pcVar4);
              testing::internal::AssertHelper::operator=(&local_740,&local_738);
              testing::internal::AssertHelper::~AssertHelper(&local_740);
              std::__cxx11::string::~string((string *)&gtest_ar.message_);
              testing::Message::~Message(&local_738);
            }
            rsa.field_2._13_3_ = 0;
            rsa.field_2._M_local_buf[0xc] = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
            if (rsa.field_2._12_4_ == 0) {
              local_778 = 0xf;
              psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                 ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                                  &gtest_ar__5.message_);
              local_780 = sk_X509_INFO_num(psVar7);
              testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                        ((EqHelper *)local_770,"(sizeof(kExpected) / sizeof((kExpected)[0]))",
                         "sk_X509_INFO_num(infos.get())",&local_778,&local_780);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
              if (!bVar2) {
                testing::Message::Message(&local_788);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&i,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xc13,pcVar4);
                testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_788);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
                testing::Message::~Message(&local_788);
              }
              rsa.field_2._13_3_ = 0;
              rsa.field_2._M_local_buf[0xc] = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
              if (rsa.field_2._12_4_ == 0) {
                for (uStack_798 = 0; uStack_798 < 0xf; uStack_798 = uStack_798 + 1) {
                  testing::ScopedTrace::ScopedTrace<unsigned_long>
                            ((ScopedTrace *)
                             ((long)&gtest_ar__6.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 7),
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0xc15,&stack0xfffffffffffff868);
                  lVar1 = uStack_798 - 1;
                  psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                     ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                                      &gtest_ar__5.message_);
                  pXVar8 = sk_X509_INFO_value(psVar7,uStack_798);
                  TestBody::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)
                             ((long)&bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                                     ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 7),
                             (ExpectedInfo *)&kExpected[lVar1].crl,pXVar8);
                  testing::ScopedTrace::~ScopedTrace
                            ((ScopedTrace *)
                             ((long)&gtest_ar__6.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             + 7));
                }
                pvVar5 = (void *)std::__cxx11::string::data();
                iVar3 = std::__cxx11::string::size();
                pBVar6 = BIO_new_mem_buf(pvVar5,iVar3);
                std::unique_ptr<bio_st,_bssl::internal::Deleter>::reset
                          ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                           (pointer)pBVar6);
                testing::AssertionResult::
                AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                          ((AssertionResult *)local_7b0,
                           (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_,
                           (type *)0x0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_7b0);
                if (!bVar2) {
                  testing::Message::Message(&local_7b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_1.message_,(internal *)local_7b0,
                             (AssertionResult *)0x8a2d4f,"false","true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_7c0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0xc1b,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_7c0);
                  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                  testing::Message::~Message(&local_7b8);
                }
                rsa.field_2._13_3_ = 0;
                rsa.field_2._M_local_buf[0xc] = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
                if (rsa.field_2._12_4_ == 0) {
                  local_7f8 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                        ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                                         &gtest_ar__5.message_);
                  pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                             &gtest_ar__4.message_);
                  psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                     ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                                      &gtest_ar__5.message_);
                  local_800 = (stack_st_X509_INFO *)
                              PEM_X509_INFO_read_bio
                                        (pBVar6,(stack_st_X509_INFO *)psVar7,(undefined1 *)0x0,
                                         (void *)0x0);
                  testing::internal::EqHelper::
                  Compare<stack_st_X509_INFO_*,_stack_st_X509_INFO_*,_nullptr>
                            ((EqHelper *)local_7f0,"infos.get()",
                             "PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr)",
                             &local_7f8,&local_800);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_7f0);
                  if (!bVar2) {
                    testing::Message::Message(&local_808);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0xc1d,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_2.message_,&local_808);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_2.message_);
                    testing::Message::~Message(&local_808);
                  }
                  rsa.field_2._13_3_ = 0;
                  rsa.field_2._M_local_buf[0xc] = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
                  if (rsa.field_2._12_4_ == 0) {
                    local_828 = 0x1e;
                    psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                       ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                                        &gtest_ar__5.message_);
                    local_830 = sk_X509_INFO_num(psVar7);
                    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                              ((EqHelper *)local_820,
                               "2 * (sizeof(kExpected) / sizeof((kExpected)[0]))",
                               "sk_X509_INFO_num(infos.get())",&local_828,&local_830);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_820);
                    if (!bVar2) {
                      testing::Message::Message(&local_838);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_820);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&i_1,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                 ,0xc1e,pcVar4);
                      testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_838);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
                      testing::Message::~Message(&local_838);
                    }
                    rsa.field_2._13_3_ = 0;
                    rsa.field_2._M_local_buf[0xc] = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
                    if (rsa.field_2._12_4_ == 0) {
                      for (uStack_848 = 0; uStack_848 < 0xf; uStack_848 = uStack_848 + 1) {
                        testing::ScopedTrace::ScopedTrace<unsigned_long>
                                  ((ScopedTrace *)(bad_pem.field_2._M_local_buf + 0xf),
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0xc20,&stack0xfffffffffffff7b8);
                        lVar1 = uStack_848 - 1;
                        psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                           ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>
                                             *)&gtest_ar__5.message_);
                        pXVar8 = sk_X509_INFO_value(psVar7,uStack_848);
                        TestBody::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)
                                   ((long)&bio._M_t.
                                           super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 7)
                                   ,(ExpectedInfo *)&kExpected[lVar1].crl,pXVar8);
                        lVar1 = uStack_848 - 1;
                        psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                           ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>
                                             *)&gtest_ar__5.message_);
                        pXVar8 = sk_X509_INFO_value(psVar7,uStack_848 + 0xf);
                        TestBody::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)
                                   ((long)&bio._M_t.
                                           super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 7)
                                   ,(ExpectedInfo *)&kExpected[lVar1].crl,pXVar8);
                        testing::ScopedTrace::~ScopedTrace
                                  ((ScopedTrace *)(bad_pem.field_2._M_local_buf + 0xf));
                      }
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&gtest_ar__7.message_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_30,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_30);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_870,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&gtest_ar__7.message_,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_208);
                      std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                      pvVar5 = (void *)std::__cxx11::string::data();
                      iVar3 = std::__cxx11::string::size();
                      pBVar6 = BIO_new_mem_buf(pvVar5,iVar3);
                      std::unique_ptr<bio_st,_bssl::internal::Deleter>::reset
                                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__4.message_,(pointer)pBVar6);
                      testing::AssertionResult::
                      AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                                ((AssertionResult *)local_8a0,
                                 (unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__4.message_,(type *)0x0);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_8a0);
                      if (!bVar2) {
                        testing::Message::Message(&local_8a8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&infos2,(internal *)local_8a0,
                                   (AssertionResult *)0x8a2d4f,"false","true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_8b0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0xc2b,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
                        testing::internal::AssertHelper::~AssertHelper(&local_8b0);
                        std::__cxx11::string::~string((string *)&infos2);
                        testing::Message::~Message(&local_8a8);
                      }
                      rsa.field_2._13_3_ = 0;
                      rsa.field_2._M_local_buf[0xc] = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
                      if (rsa.field_2._12_4_ == 0) {
                        pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                                   &gtest_ar__4.message_);
                        psVar7 = (pointer)PEM_X509_INFO_read_bio
                                                    (pBVar6,(stack_st_X509_INFO *)0x0,
                                                     (undefined1 *)0x0,(void *)0x0);
                        std::unique_ptr<stack_st_X509_INFO,bssl::internal::Deleter>::
                        unique_ptr<bssl::internal::Deleter,void>
                                  ((unique_ptr<stack_st_X509_INFO,bssl::internal::Deleter> *)
                                   &gtest_ar__8.message_,psVar7);
                        local_8e9 = std::unique_ptr::operator_cast_to_bool
                                              ((unique_ptr *)&gtest_ar__8.message_);
                        local_8e9 = !local_8e9;
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_8e8,&local_8e9,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_8e8);
                        if (!bVar2) {
                          testing::Message::Message(&local_8f8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__9.message_,(internal *)local_8e8,
                                     (AssertionResult *)"infos2","true","false",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_900,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                     ,0xc2e,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_900,&local_8f8);
                          testing::internal::AssertHelper::~AssertHelper(&local_900);
                          std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                          testing::Message::~Message(&local_8f8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
                        pvVar5 = (void *)std::__cxx11::string::data();
                        iVar3 = std::__cxx11::string::size();
                        pBVar6 = BIO_new_mem_buf(pvVar5,iVar3);
                        std::unique_ptr<bio_st,_bssl::internal::Deleter>::reset
                                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__4.message_,(pointer)pBVar6);
                        testing::AssertionResult::
                        AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                                  ((AssertionResult *)local_930,
                                   (unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__4.message_,(type *)0x0);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_930);
                        if (!bVar2) {
                          testing::Message::Message(&local_938);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__10.message_,(internal *)local_930,
                                     (AssertionResult *)0x8a2d4f,"false","true",in_R9);
                          pcVar4 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_940,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                     ,0xc31,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_940,&local_938);
                          testing::internal::AssertHelper::~AssertHelper(&local_940);
                          std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                          testing::Message::~Message(&local_938);
                        }
                        rsa.field_2._13_3_ = 0;
                        rsa.field_2._M_local_buf[0xc] = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
                        if (rsa.field_2._12_4_ == 0) {
                          pBVar6 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)
                                                     &gtest_ar__4.message_);
                          psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                             ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>
                                               *)&gtest_ar__5.message_);
                          psVar9 = PEM_X509_INFO_read_bio
                                             (pBVar6,(stack_st_X509_INFO *)psVar7,(undefined1 *)0x0,
                                              (void *)0x0);
                          local_971 = psVar9 == (stack_st_X509_INFO *)0x0;
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_970,&local_971,(type *)0x0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_970);
                          if (!bVar2) {
                            testing::Message::Message(&local_980);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_3.message_,(internal *)local_970,
                                       (AssertionResult *)
                                       "PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr)"
                                       ,"true","false",in_R9);
                            pcVar4 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_988,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0xc33,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_988,&local_980);
                            testing::internal::AssertHelper::~AssertHelper(&local_988);
                            std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                            testing::Message::~Message(&local_980);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
                          local_9c0 = 0x1e;
                          psVar7 = std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::get
                                             ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>
                                               *)&gtest_ar__5.message_);
                          local_9c8 = sk_X509_INFO_num(psVar7);
                          testing::internal::EqHelper::
                          Compare<unsigned_long,_unsigned_long,_nullptr>
                                    ((EqHelper *)local_9b8,
                                     "2 * (sizeof(kExpected) / sizeof((kExpected)[0]))",
                                     "sk_X509_INFO_num(infos.get())",&local_9c0,&local_9c8);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_9b8);
                          if (!bVar2) {
                            testing::Message::Message(&local_9d0);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_9b8);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_9d8,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0xc34,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_9d8,&local_9d0);
                            testing::internal::AssertHelper::~AssertHelper(&local_9d8);
                            testing::Message::~Message(&local_9d0);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b8);
                          rsa.field_2._12_4_ = 0;
                        }
                        std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                                   &gtest_ar__8.message_);
                      }
                      std::__cxx11::string::~string((string *)local_870);
                    }
                  }
                }
              }
            }
            std::unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<stack_st_X509_INFO,_bssl::internal::Deleter> *)
                       &gtest_ar__5.message_);
          }
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__4.message_);
          std::__cxx11::string::~string((string *)local_258);
          std::__cxx11::string::~string((string *)local_230);
          std::__cxx11::string::~string((string *)local_208);
          std::__cxx11::string::~string((string *)local_1e0);
        }
        std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
      std::__cxx11::string::~string((string *)local_128);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    std::__cxx11::string::~string((string *)local_b8);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(X509Test, PEMX509Info) {
  std::string cert = kRootCAPEM;
  auto cert_obj = CertFromPEM(kRootCAPEM);
  ASSERT_TRUE(cert_obj);

  std::string rsa = kRSAKey;
  auto rsa_obj = PrivateKeyFromPEM(kRSAKey);
  ASSERT_TRUE(rsa_obj);

  std::string crl = kBasicCRL;
  auto crl_obj = CRLFromPEM(kBasicCRL);
  ASSERT_TRUE(crl_obj);

  bssl::UniquePtr<EVP_PKEY> placeholder_key(EVP_PKEY_new());
  ASSERT_TRUE(placeholder_key);

  std::string unknown =
      "-----BEGIN UNKNOWN-----\n"
      "AAAA\n"
      "-----END UNKNOWN-----\n";

  std::string invalid =
      "-----BEGIN CERTIFICATE-----\n"
      "AAAA\n"
      "-----END CERTIFICATE-----\n";

  std::string encrypted_key = R"(-----BEGIN EC PRIVATE KEY-----
Proc-Type: 4,ENCRYPTED
DEK-Info: AES-128-CBC,B3B2988AECAE6EAB0D043105994C1123

RK7DUIGDHWTFh2rpTX+dR88hUyC1PyDlIULiNCkuWFwHrJbc1gM6hMVOKmU196XC
iITrIKmilFm9CPD6Tpfk/NhI/QPxyJlk1geIkxpvUZ2FCeMuYI1To14oYOUKv14q
wr6JtaX2G+pOmwcSPymZC4u2TncAP7KHgS8UGcMw8CE=
-----END EC PRIVATE KEY-----
)";

  // Each X509_INFO contains at most one certificate, CRL, etc. The format
  // creates a new X509_INFO when a repeated type is seen.
  std::string pem =
      // The first few entries have one of everything in different orders.
      cert + rsa + crl + rsa + crl + cert +
      // Unknown types are ignored.
      crl + unknown + cert + rsa +
      // Seeing a new certificate starts a new entry, so now we have a bunch of
      // certificate-only entries.
      cert + cert + cert +
      // The key folds into the certificate's entry.
      cert + rsa +
      // Doubled keys also start new entries.
      rsa + rsa + rsa + rsa + crl +
      // As do CRLs.
      crl + crl +
      // Encrypted private keys are not decrypted (decryption failures would be
      // fatal) and just returned as placeholder.
      crl + cert + encrypted_key +
      // Placeholder keys are still keys, so a new key starts a new entry.
      rsa;

  const struct ExpectedInfo {
    const X509 *cert;
    const EVP_PKEY *key;
    const X509_CRL *crl;
  } kExpected[] = {
      {cert_obj.get(), rsa_obj.get(), crl_obj.get()},
      {cert_obj.get(), rsa_obj.get(), crl_obj.get()},
      {cert_obj.get(), rsa_obj.get(), crl_obj.get()},
      {cert_obj.get(), nullptr, nullptr},
      {cert_obj.get(), nullptr, nullptr},
      {cert_obj.get(), nullptr, nullptr},
      {cert_obj.get(), rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), nullptr},
      {nullptr, rsa_obj.get(), crl_obj.get()},
      {nullptr, nullptr, crl_obj.get()},
      {nullptr, nullptr, crl_obj.get()},
      {cert_obj.get(), placeholder_key.get(), crl_obj.get()},
      {nullptr, rsa_obj.get(), nullptr},
  };

  auto check_info = [](const ExpectedInfo *expected, const X509_INFO *info) {
    if (expected->cert != nullptr) {
      EXPECT_EQ(0, X509_cmp(expected->cert, info->x509));
    } else {
      EXPECT_EQ(nullptr, info->x509);
    }
    if (expected->crl != nullptr) {
      EXPECT_EQ(0, X509_CRL_cmp(expected->crl, info->crl));
    } else {
      EXPECT_EQ(nullptr, info->crl);
    }
    if (expected->key != nullptr) {
      ASSERT_NE(nullptr, info->x_pkey);
      if (EVP_PKEY_id(expected->key) == EVP_PKEY_NONE) {
        // Expect a placeholder key.
        EXPECT_FALSE(info->x_pkey->dec_pkey);
      } else {
        // EVP_PKEY_cmp returns one if the keys are equal.
        ASSERT_TRUE(info->x_pkey->dec_pkey);
        EXPECT_EQ(1, EVP_PKEY_cmp(expected->key, info->x_pkey->dec_pkey));
      }
    } else {
      EXPECT_EQ(nullptr, info->x_pkey);
    }
  };

  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(pem.data(), pem.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<STACK_OF(X509_INFO)> infos(
      PEM_X509_INFO_read_bio(bio.get(), nullptr, nullptr, nullptr));
  ASSERT_TRUE(infos);
  ASSERT_EQ(OPENSSL_ARRAY_SIZE(kExpected), sk_X509_INFO_num(infos.get()));
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kExpected); i++) {
    SCOPED_TRACE(i);
    check_info(&kExpected[i], sk_X509_INFO_value(infos.get(), i));
  }

  // Passing an existing stack appends to it.
  bio.reset(BIO_new_mem_buf(pem.data(), pem.size()));
  ASSERT_TRUE(bio);
  ASSERT_EQ(infos.get(),
            PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr));
  ASSERT_EQ(2 * OPENSSL_ARRAY_SIZE(kExpected), sk_X509_INFO_num(infos.get()));
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kExpected); i++) {
    SCOPED_TRACE(i);
    check_info(&kExpected[i], sk_X509_INFO_value(infos.get(), i));
    check_info(
        &kExpected[i],
        sk_X509_INFO_value(infos.get(), i + OPENSSL_ARRAY_SIZE(kExpected)));
  }

  // Gracefully handle errors in both the append and fresh cases.
  std::string bad_pem = cert + cert + invalid;

  bio.reset(BIO_new_mem_buf(bad_pem.data(), bad_pem.size()));
  ASSERT_TRUE(bio);
  bssl::UniquePtr<STACK_OF(X509_INFO)> infos2(
      PEM_X509_INFO_read_bio(bio.get(), nullptr, nullptr, nullptr));
  EXPECT_FALSE(infos2);

  bio.reset(BIO_new_mem_buf(bad_pem.data(), bad_pem.size()));
  ASSERT_TRUE(bio);
  EXPECT_FALSE(
      PEM_X509_INFO_read_bio(bio.get(), infos.get(), nullptr, nullptr));
  EXPECT_EQ(2 * OPENSSL_ARRAY_SIZE(kExpected), sk_X509_INFO_num(infos.get()));
}